

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timing.cpp
# Opt level: O1

vector<double,_std::allocator<double>_> * __thiscall
Timing::GetRunningEventDurations
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,Timing *this,string *id)

{
  long lVar1;
  iterator __position;
  const_iterator cVar2;
  long lVar3;
  long lVar4;
  ostream *poVar5;
  undefined8 *puVar6;
  _Base_ptr p_Var7;
  tms timeStruct;
  double local_1e0;
  long local_1d8;
  long local_1d0;
  undefined1 local_1b8 [392];
  
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Timing::Times,_std::allocator<Timing::Times>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Timing::Times,_std::allocator<Timing::Times>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Timing::Times,_std::allocator<Timing::Times>_>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Timing::Times,_std::allocator<Timing::Times>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Timing::Times,_std::allocator<Timing::Times>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Timing::Times,_std::allocator<Timing::Times>_>_>_>_>
                  *)this,id);
  if ((_Rb_tree_header *)cVar2._M_node != &(this->_m_timesMap)._M_t._M_impl.super__Rb_tree_header) {
    p_Var7 = *(_Base_ptr *)(cVar2._M_node + 2);
    if (p_Var7 != cVar2._M_node[2]._M_parent) {
      do {
        if (*(char *)&p_Var7->_M_left == '\0') {
          times((tms *)local_1b8);
          lVar3 = local_1b8._8_8_ + local_1b8._0_8_;
          lVar1 = *(long *)p_Var7;
          lVar4 = sysconf(2);
          local_1e0 = (double)(lVar3 - lVar1) / (double)lVar4;
          __position._M_current =
               (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl
               .super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      (__return_storage_ptr__,__position,&local_1e0);
          }
          else {
            *__position._M_current = local_1e0;
            (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
        }
        p_Var7 = (_Base_ptr)&p_Var7->_M_right;
      } while (p_Var7 != cVar2._M_node[2]._M_parent);
    }
    return __return_storage_ptr__;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1b8 + 0x10),"Timing::GetRunningEventDurations No events called \"",
             0x33);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)(local_1b8 + 0x10),(id->_M_dataplus)._M_p,id->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" have been stored",0x12);
  puVar6 = (undefined8 *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  *puVar6 = &PTR__E_0059bd80;
  puVar6[1] = puVar6 + 3;
  std::__cxx11::string::_M_construct<char*>((string *)(puVar6 + 1),local_1d8,local_1d0 + local_1d8);
  __cxa_throw(puVar6,&E::typeinfo,E::~E);
}

Assistant:

vector<double> Timing::GetRunningEventDurations(const std::string & id) const
{
    vector<double> durations;

    map <string, vector<Times> >::const_iterator it=_m_timesMap.find(id);
    if(it==_m_timesMap.end())
    {
        stringstream ss;
        ss << "Timing::GetRunningEventDurations No events called \""
           << id << "\" have been stored";
        throw(E(ss.str()));
    }
    else
    {
        const vector<Times> &times=it->second;
        for(vector<Times>::const_iterator j=times.begin();
            j!=times.end();++j)
        {
            // here we are only interested in events that are still running
            if(!j->hasEnded)
                durations.push_back(ClockToSeconds(GetCpuTime() - j->start));
        }
    }
    return(durations);
}